

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryRegister.cpp
# Opt level: O0

void __thiscall
amrex::BndryRegister::BndryRegister
          (BndryRegister *this,BoxArray *grids_,DistributionMapping *dmap,int in_rad,int out_rad,
          int extent_rad,int ncomp)

{
  void *pvVar1;
  undefined8 *in_RDI;
  undefined4 in_stack_00000008;
  OrientationIter face;
  int in_stack_0000005c;
  int in_stack_00000060;
  int in_stack_00000064;
  undefined4 in_stack_00000068;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  BoxArray *in_stack_ffffffffffffff70;
  undefined8 *local_50;
  OrientationIter local_40 [15];
  IndexType local_4;
  
  *in_RDI = &PTR__BndryRegister_01803048;
  local_50 = in_RDI + 1;
  do {
    FabSet::FabSet((FabSet *)0x10543e8);
    local_50 = local_50 + 0x30;
  } while (local_50 != in_RDI + 0x121);
  BoxArray::BoxArray(in_stack_ffffffffffffff70,
                     (BoxArray *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  OrientationIter::OrientationIter(local_40);
  while( true ) {
    pvVar1 = OrientationIter::operator_cast_to_void_(local_40);
    if (pvVar1 == (void *)0x0) break;
    OrientationIter::operator()
              ((OrientationIter *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    IndexType::IndexType(&local_4,CELL,CELL,CELL);
    in_stack_ffffffffffffff68 = in_stack_00000008;
    define((BndryRegister *)CONCAT44(extent_rad,in_stack_00000068),(Orientation)in_rad,
           (IndexType)out_rad,in_stack_00000064,in_stack_00000060,in_stack_0000005c,(int)grids_,
           (DistributionMapping *)this);
    OrientationIter::operator++(local_40);
  }
  return;
}

Assistant:

BndryRegister::BndryRegister (const BoxArray& grids_,
                              const DistributionMapping& dmap,
                              int             in_rad,
                              int             out_rad,
                              int             extent_rad,
                              int             ncomp)
    :
    grids(grids_)
{
    BL_ASSERT(ncomp > 0);
    BL_ASSERT(grids[0].cellCentered());

    for (OrientationIter face; face; ++face)
    {
        define(face(),IndexType::TheCellType(),in_rad,out_rad,extent_rad,ncomp,dmap);
    }
}